

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkDescriptorSetLayoutCreateInfo *layout,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  VkDescriptorSetLayoutBinding *pVVar1;
  VkDescriptorSetLayoutCreateInfo *pVVar2;
  bool bVar3;
  ulong uVar4;
  uint32_t j;
  ulong uVar5;
  Value binding;
  Value immutables;
  Value bindings;
  Data local_118;
  Data local_108;
  char *local_f8;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  Data *local_e0;
  VkDescriptorSetLayoutCreateInfo *local_d8;
  ulong local_d0;
  Data local_c8;
  StringRefType local_b0;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  Fossilize local_50 [16];
  StringRefType local_40;
  
  local_108.n.i64 = (Number)0x0;
  local_108.s.str = (Ch *)0x3000000000000;
  local_40.s = "flags";
  local_40.length = 5;
  local_e0 = &out_value->data_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_108.s,&local_40,layout->flags,alloc);
  local_c8.n = (Number)0x0;
  local_c8.s.str = (Ch *)0x4000000000000;
  uVar4 = 0;
  local_d8 = layout;
  while (pVVar2 = local_d8, uVar4 < local_d8->bindingCount) {
    pVVar1 = local_d8->pBindings;
    local_118.n.i64 = (Number)0x0;
    local_118.s.str = (Ch *)0x3000000000000;
    local_70.s = "descriptorType";
    local_70.length = 0xe;
    local_d0 = uVar4;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<VkDescriptorType>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_118.s,&local_70,pVVar1[uVar4].descriptorType,alloc);
    local_80.s = "descriptorCount";
    local_80.length = 0xf;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_118.s,&local_80,pVVar1[uVar4].descriptorCount,alloc);
    local_90.s = "stageFlags";
    local_90.length = 10;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_118.s,&local_90,pVVar1[uVar4].stageFlags,alloc);
    local_a0.s = "binding";
    local_a0.length = 7;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_118.s,&local_a0,pVVar1[uVar4].binding,alloc);
    if (pVVar1[uVar4].pImmutableSamplers != (VkSampler *)0x0) {
      local_f8 = (char *)0x0;
      _uStack_f0 = (Ch *)0x4000000000000;
      for (uVar5 = 0; uVar5 < pVVar1[uVar4].descriptorCount; uVar5 = uVar5 + 1) {
        uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  (local_50,(uint64_t)pVVar1[uVar4].pImmutableSamplers[uVar5],alloc);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_f8,
                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_50,alloc);
      }
      local_b0.s = "immutableSamplers";
      local_b0.length = 0x11;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_118.s,&local_b0,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_f8,alloc);
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_c8.s,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_118.s,alloc);
    uVar4 = local_d0 + 1;
  }
  local_60.s = "bindings";
  local_60.length = 8;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_108.s,&local_60,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,alloc);
  if (pVVar2->pNext != (void *)0x0) {
    local_118.n = (Number)0x0;
    local_118.s.str = (Ch *)0x0;
    bVar3 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      (pVVar2->pNext,alloc,(Value *)&local_118.s,(DynamicStateInfo *)0x0);
    if (!bVar3) {
      return false;
    }
    local_f8 = "pNext";
    uStack_f0 = 5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_108.s,(StringRefType *)&local_f8,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_118.s,alloc);
  }
  if (&local_108 != local_e0) {
    local_e0->n = local_108.n;
    (&local_e0->n)[1] = (Number)local_108.s.str;
  }
  return true;
}

Assistant:

static bool json_value(const VkDescriptorSetLayoutCreateInfo& layout, Allocator& alloc, Value *out_value)
{
	Value l(kObjectType);
	l.AddMember("flags", layout.flags, alloc);

	Value bindings(kArrayType);
	for (uint32_t i = 0; i < layout.bindingCount; i++)
	{
		auto &b = layout.pBindings[i];
		Value binding(kObjectType);
		binding.AddMember("descriptorType", b.descriptorType, alloc);
		binding.AddMember("descriptorCount", b.descriptorCount, alloc);
		binding.AddMember("stageFlags", b.stageFlags, alloc);
		binding.AddMember("binding", b.binding, alloc);
		if (b.pImmutableSamplers)
		{
			Value immutables(kArrayType);
			for (uint32_t j = 0; j < b.descriptorCount; j++)
				immutables.PushBack(uint64_string(api_object_cast<uint64_t>(b.pImmutableSamplers[j]), alloc), alloc);
			binding.AddMember("immutableSamplers", immutables, alloc);
		}
		bindings.PushBack(binding, alloc);
	}
	l.AddMember("bindings", bindings, alloc);

	if (!pnext_chain_add_json_value(l, layout, alloc, nullptr))
		return false;

	*out_value = l;
	return true;
}